

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  ulong uVar1;
  sysbvm_object_tuple_t *psVar2;
  uint64_t uVar3;
  sysbvm_tuple_t sVar4;
  uint64_t value;
  
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).metaclassType,0x1e);
  psVar2[2].header.field_0.typePointer = supertype;
  psVar2[4].field_1.pointers[0] = 0x1b;
  uVar3 = 0x1d;
  if ((supertype & 0xf) == 0 && supertype != 0) {
    uVar1 = *(ulong *)(supertype + 0x58);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      value = (long)uVar1 >> 4;
    }
    else {
      value = *(uint64_t *)(uVar1 + 0x10);
    }
    if ((0x1d < value) && (uVar3 = value, value + 0x800000000000000 >> 0x3c != 0)) {
      sVar4 = sysbvm_tuple_uint64_encodeBig(context,value);
      goto LAB_00145191;
    }
  }
  sVar4 = uVar3 << 4 | 0xb;
LAB_00145191:
  psVar2[3].field_1.pointers[0] = sVar4;
  psVar2[4].header.field_0.typePointer = 0xb;
  psVar2[4].header.identityHashAndFlags = 0xb;
  psVar2[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_metaclass_t* result = (sysbvm_metaclass_t*)sysbvm_context_allocatePointerTuple(context, context->roots.metaclassType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_metaclass_t));
    result->super.super.supertype = supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t);
    if(supertype)
    {
        size_t superTypeSlotCount = sysbvm_type_getTotalSlotCount(supertype);
        if(superTypeSlotCount > slotCount)
            slotCount = superTypeSlotCount;
    }
    
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}